

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool item_tester_uncursable(object *obj)

{
  curse_data *pcVar1;
  ulong local_28;
  size_t i;
  curse_data *c;
  object *obj_local;
  
  pcVar1 = obj->known->curses;
  if (pcVar1 != (curse_data *)0x0) {
    for (local_28 = 1; local_28 < z_info->curse_max; local_28 = local_28 + 1) {
      if ((L'\0' < pcVar1[local_28].power) && (pcVar1[local_28].power < L'd')) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool item_tester_uncursable(const struct object *obj)
{
	struct curse_data *c = obj->known->curses;
	if (c) {
		size_t i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power > 0 && c[i].power < 100) {
				return true;
			}
		}
	}
	return false;
}